

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolInfo.cpp
# Opt level: O2

string * CError::GetHasNoMemberErrorMessage
                   (string *__return_storage_ptr__,string *className,string *fieldName)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"Class: ",className);
  std::operator+(&bStack_78,&local_38," has no member: ");
  std::operator+(&local_58,&bStack_78,fieldName);
  std::operator+(__return_storage_ptr__,&local_58,".");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&bStack_78);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string CError::GetHasNoMemberErrorMessage(const std::string &className, const std::string &fieldName) {
    std::string errorMessage = "Class: " + className + " has no member: " + fieldName + ".";
	return errorMessage;
}